

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.h
# Opt level: O2

void __thiscall
Js::ScriptContext::RejitStats::RejitStats(RejitStats *this,ScriptContext *scriptContext)

{
  uint *puVar1;
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  ArenaAllocator *this_01;
  
  this->m_totalRejits = 0;
  this->m_totalBailouts = 0;
  this_01 = &scriptContext->generalAllocator;
  puVar1 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                     ((Memory *)this_01,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,0x2d);
  this->m_rejitReasonCounts = puVar1;
  this_00 = (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::ArenaAllocator>(0x38,this_01,0x35916e);
  JsUtil::
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,this_01,0);
  this->m_bailoutReasonCounts = this_00;
  return;
}

Assistant:

RejitStats(ScriptContext *scriptContext) : m_totalRejits(0), m_totalBailouts(0)
            {
                m_rejitReasonCounts = AnewArrayZ(scriptContext->GeneralAllocator(), uint, NumRejitReasons);
                m_bailoutReasonCounts = Anew(scriptContext->GeneralAllocator(), BailoutStatsMap, scriptContext->GeneralAllocator());
            }